

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O2

void Hop_ObjDelete(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0xbc,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
  }
  uVar3 = *(uint *)&pObj->field_0x20;
  if (((uVar3 & 6) != 2) && ((uVar3 & 7) != 1)) {
    if (0x3f < uVar3) {
      __assert_fail("Hop_ObjRefs(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                    ,0xbe,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
    }
    p->nObjs[uVar3 & 7] = p->nObjs[uVar3 & 7] + -1;
    p->nDeleted = p->nDeleted + 1;
    Hop_ObjDisconnect(p,pObj);
    uVar3 = *(uint *)&pObj->field_0x20;
    if ((uVar3 & 7) == 2) {
      pVVar1 = p->vPis;
      uVar3 = pVVar1->nSize;
      uVar4 = (ulong)uVar3;
      do {
        if ((int)uVar4 < 1) {
          __assert_fail("i >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
        }
        uVar5 = uVar4 - 1;
        lVar2 = uVar4 - 1;
        uVar4 = uVar5;
      } while ((Hop_Obj_t *)pVVar1->pArray[lVar2] != pObj);
      while (uVar4 = uVar5 + 1, (int)uVar4 < (int)uVar3) {
        pVVar1->pArray[uVar5] = pVVar1->pArray[uVar4];
        uVar5 = uVar4;
      }
      pVVar1->nSize = uVar3 - 1;
      uVar3 = *(uint *)&pObj->field_0x20;
    }
    *(uint *)&pObj->field_0x20 = uVar3 & 0xfffffff8;
    pObj->field_0 = (anon_union_8_2_00a17ec8_for_Hop_Obj_t__0)p->pListFree;
    p->pListFree = pObj;
    return;
  }
  __assert_fail("!Hop_ObjIsTerm(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                ,0xbd,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjDelete( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( !Hop_ObjIsTerm(pObj) );
    assert( Hop_ObjRefs(pObj) == 0 );
    // update node counters of the manager
    p->nObjs[pObj->Type]--;
    p->nDeleted++;
    // remove connections
    Hop_ObjDisconnect( p, pObj );
    // remove PIs/POs from the arrays
    if ( Hop_ObjIsPi(pObj) )
        Vec_PtrRemove( p->vPis, pObj );
    // free the node
    Hop_ManRecycleMemory( p, pObj );
}